

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O1

char * string_from_atom(atom_server as,atom_t atom)

{
  int iVar1;
  Tcl_HashEntry *pTVar2;
  char *pcVar3;
  size_t sVar4;
  ssize_t sVar5;
  send_get_atom_msg_ptr msg;
  char buf [100];
  send_get_atom_msg tmp_rec;
  char local_98 [104];
  _send_get_atom_msg local_30;
  
  pTVar2 = (*(as->value_hash_table).findProc)(&as->value_hash_table,(char *)(long)atom);
  if (pTVar2 == (Tcl_HashEntry *)0x0) {
    pcVar3 = local_98 + 1;
    iVar1 = 0x108110;
    sprintf(pcVar3,"N%d",atom);
    iVar1 = establish_server_connection(as,iVar1);
    if (iVar1 == 0) {
      return (char *)0x0;
    }
    sVar4 = strlen(pcVar3);
    local_98[0] = (char)sVar4;
    sVar5 = write(as->tcp_fd,local_98,(long)local_98[0] + 1);
    if (sVar5 != (long)local_98[0] + 1) {
      pcVar3 = "write";
LAB_00103f12:
      perror(pcVar3);
      return (char *)0x0;
    }
    set_blocking(as,1);
    local_98[1] = '\0';
    do {
      sVar5 = read(as->tcp_fd,local_98,1);
      if ((int)sVar5 == -1) {
        pcVar3 = "read";
        goto LAB_00103f12;
      }
      sVar5 = read(as->tcp_fd,pcVar3,(long)local_98[0]);
      if ((int)sVar5 != (int)local_98[0]) {
        pcVar3 = "read2";
        goto LAB_00103f12;
      }
      local_98[(int)sVar5 + 1] = '\0';
      if (local_98[1] != 'S') {
        handle_unexpected_msg(as,pcVar3);
      }
    } while (local_98[1] != 'S');
    if (local_98[2] == '\0') {
      return (char *)0x0;
    }
    local_30.atom_string = local_98 + 2;
    msg = &local_30;
    local_30.atom = atom;
    enter_atom_into_cache(as,msg);
  }
  else {
    msg = (send_get_atom_msg_ptr)pTVar2->clientData;
  }
  if (msg->atom_string == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar3 = strdup(msg->atom_string);
  return pcVar3;
}

Assistant:

extern
char *
string_from_atom(atom_server as, atom_t atom)
{
    send_get_atom_msg tmp_rec;
    send_get_atom_msg_ptr stored;
    Tcl_HashEntry *entry = NULL;
    int numbytes;
    char buf[MAXDATASIZE];

    entry = Tcl_FindHashEntry(&as->value_hash_table, (char *) (int64_t) atom);

    if (entry == NULL) {
	sprintf(&buf[1], "N%d", atom);
	if (establish_server_connection(as, 1) == 0) return NULL;
	buf[0] = (char) strlen(&buf[1]);
	if (write(as->tcp_fd, buf, buf[0]+1) != buf[0] + 1) {
	    perror("write");
	    return NULL;
	}
	set_blocking(as, 1);	/* set server fd blocking */
	buf[1] = 0;
	while (buf[1] != 'S') {
	    if ((numbytes = read(as->tcp_fd, buf, 1)) == -1) {
		perror("read");
		return NULL;
	    }
	    if ((numbytes = read(as->tcp_fd, &buf[1], buf[0])) != buf[0]) {
		perror("read2");
		return NULL;
	    }
	    buf[numbytes+1] = 0;
	    if (buf[1] != 'S')
		handle_unexpected_msg(as, &buf[1]);
	}

	if (buf[2] == 0) {
	    return NULL;
	}
	tmp_rec.atom_string = &buf[2];
	tmp_rec.atom = atom;

	(void) enter_atom_into_cache(as, &tmp_rec);
	stored = &tmp_rec;
    } else {
	stored = (send_get_atom_msg_ptr) Tcl_GetHashValue(entry);
    }
    if (stored->atom_string != NULL) {
	return strdup(stored->atom_string);
    } else {
	return NULL;
    }
}